

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-interp.cc
# Opt level: O1

Result __thiscall
wabt::interp::anon_unknown_1::BinaryReaderInterp::OnCatchExpr
          (BinaryReaderInterp *this,Index tag_index)

{
  uint uVar1;
  int iVar2;
  State *pSVar3;
  pointer pLVar4;
  pointer pLVar5;
  pointer pHVar6;
  pointer pLVar7;
  Result RVar8;
  Enum EVar9;
  Offset OVar10;
  long lVar11;
  Location loc;
  Location loc_1;
  Location local_b8;
  Location local_98;
  Var local_78;
  
  local_b8.field_1.field_0.last_column = 0;
  local_b8.filename._M_len = (this->filename_)._M_len;
  local_b8.filename._M_str = (this->filename_)._M_str;
  pSVar3 = (this->super_BinaryReaderNop).super_BinaryReaderDelegate.state;
  local_b8.field_1.field_1.offset =
       (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)pSVar3->offset;
  local_98.field_1.field_0.last_column = 0;
  local_98.filename._M_len = (this->filename_)._M_len;
  local_98.filename._M_str = (this->filename_)._M_str;
  local_98.field_1.field_1.offset =
       (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)pSVar3->offset;
  Var::Var(&local_78,tag_index,&local_98);
  RVar8 = SharedValidator::OnCatch(&this->validator_,&local_b8,&local_78,false);
  Var::~Var(&local_78);
  EVar9 = Error;
  if (RVar8.enum_ != Error) {
    pLVar4 = (this->label_stack_).
             super__Vector_base<wabt::interp::(anonymous_namespace)::Label,_std::allocator<wabt::interp::(anonymous_namespace)::Label>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pLVar5 = (this->label_stack_).
             super__Vector_base<wabt::interp::(anonymous_namespace)::Label,_std::allocator<wabt::interp::(anonymous_namespace)::Label>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    lVar11 = (long)pLVar5 - (long)pLVar4;
    if (lVar11 == 0) {
      __assert_fail("depth < label_stack_.size()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/src/interp/binary-reader-interp.cc"
                    ,0x180,
                    "Label *wabt::interp::(anonymous namespace)::BinaryReaderInterp::GetLabel(Index)"
                   );
    }
    uVar1 = pLVar5[-1].handler_desc_index;
    pHVar6 = (this->func_->handlers).
             super__Vector_base<wabt::interp::HandlerDesc,_std::allocator<wabt::interp::HandlerDesc>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pHVar6[uVar1].kind = Catch;
    if (pLVar5[-1].kind == Block) {
      Istream::EmitCatchDrop(this->istream_,1);
    }
    iVar2 = *(int *)((long)pLVar4 + lVar11 + -0xc);
    Istream::Emit(this->istream_,Br);
    if (iVar2 != -1) {
      __assert_fail("offset == Istream::kInvalidOffset",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/src/interp/binary-reader-interp.cc"
                    ,0x606,
                    "virtual Result wabt::interp::(anonymous namespace)::BinaryReaderInterp::OnCatchExpr(Index)"
                   );
    }
    pLVar5 = (this->label_stack_).
             super__Vector_base<wabt::interp::(anonymous_namespace)::Label,_std::allocator<wabt::interp::(anonymous_namespace)::Label>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    pLVar7 = (this->label_stack_).
             super__Vector_base<wabt::interp::(anonymous_namespace)::Label,_std::allocator<wabt::interp::(anonymous_namespace)::Label>_>
             ._M_impl.super__Vector_impl_data._M_start;
    OVar10 = Istream::end(this->istream_);
    FixupMap::Append(&this->depth_fixups_,(int)((ulong)((long)pLVar5 - (long)pLVar7) >> 4) - 1,
                     OVar10);
    Istream::Emit(this->istream_,0xffffffff);
    if (pHVar6[uVar1].try_end_offset == 0xffffffff) {
      OVar10 = Istream::end(this->istream_);
      pHVar6[uVar1].try_end_offset = OVar10;
    }
    *(undefined4 *)((long)pLVar4 + lVar11 + -0x10) = 0;
    local_b8.filename._M_len = CONCAT44(local_b8.filename._M_len._4_4_,tag_index);
    OVar10 = Istream::end(this->istream_);
    local_b8.filename._M_len = CONCAT44(OVar10,(undefined4)local_b8.filename._M_len);
    std::vector<wabt::interp::CatchDesc,_std::allocator<wabt::interp::CatchDesc>_>::
    emplace_back<wabt::interp::CatchDesc>(&pHVar6[uVar1].catches,(CatchDesc *)&local_b8);
    EVar9 = Ok;
  }
  return (Result)EVar9;
}

Assistant:

Result BinaryReaderInterp::OnCatchExpr(Index tag_index) {
  CHECK_RESULT(
      validator_.OnCatch(GetLocation(), Var(tag_index, GetLocation()), false));
  Label* label = TopLabel();
  HandlerDesc& desc = func_->handlers[label->handler_desc_index];
  desc.kind = HandlerKind::Catch;
  // Drop the previous block's exception if it was a catch.
  if (label->kind == LabelKind::Block) {
    istream_.EmitCatchDrop(1);
  }
  // Jump to the end of the block at the end of the previous try or catch.
  Istream::Offset offset = label->offset;
  istream_.Emit(Opcode::Br);
  assert(offset == Istream::kInvalidOffset);
  depth_fixups_.Append(label_stack_.size() - 1, istream_.end());
  istream_.Emit(offset);
  // The offset is only set after the first catch block, as the offset range
  // should only cover the try block itself.
  if (desc.try_end_offset == Istream::kInvalidOffset) {
    desc.try_end_offset = istream_.end();
  }
  // The label kind is switched to Block from Try in order to distinguish
  // catch blocks from try blocks. This is used to ensure that a try-delegate
  // inside this catch will not delegate to the catch, and instead find outer
  // try blocks to use as a delegate target.
  label->kind = LabelKind::Block;
  desc.catches.push_back(CatchDesc{tag_index, istream_.end()});
  return Result::Ok;
}